

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReduceMinLayerParams::ReduceMinLayerParams
          (ReduceMinLayerParams *this,ReduceMinLayerParams *from)

{
  bool bVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReduceMinLayerParams_00400f88;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_,&from->axes_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = from->reduceall_;
  this->keepdims_ = from->keepdims_;
  this->reduceall_ = bVar1;
  return;
}

Assistant:

ReduceMinLayerParams::ReduceMinLayerParams(const ReduceMinLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      axes_(from.axes_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&keepdims_, &from.keepdims_,
    static_cast<size_t>(reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_)) + sizeof(reduceall_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReduceMinLayerParams)
}